

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::FiberBase::FiberBase
          (FiberBase *this,FiberPool *pool,ExceptionOrValue *result,SourceLocation location)

{
  FiberStack *this_00;
  Maybe<kj::_::Mutex::Waiter_&> local_38;
  Maybe<kj::_::Mutex::Waiter_&> *pMStack_30;
  _Map_pointer local_28;
  ExceptionOrValue *local_20;
  ExceptionOrValue *result_local;
  FiberPool *pool_local;
  FiberBase *this_local;
  
  local_20 = result;
  result_local = (ExceptionOrValue *)pool;
  pool_local = (FiberPool *)this;
  PromiseNode::PromiseNode(&this->super_PromiseNode);
  local_28 = (_Map_pointer)location._16_8_;
  local_38.ptr = (Waiter *)location.fileName;
  pMStack_30 = (Maybe<kj::_::Mutex::Waiter_&> *)location.function;
  Event::Event(&this->super_Event,location);
  (this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
       (_func_int **)&PTR___cxa_pure_virtual_0059ed30;
  (this->super_Event)._vptr_Event = (_func_int **)&DAT_0059ed80;
  this->state = WAITING;
  this->currentInner = (OwnPromiseNode *)0x0;
  PromiseNode::OnReadyEvent::OnReadyEvent(&this->onReadyEvent);
  Own<kj::_::FiberStack,_std::nullptr_t>::Own(&this->stack);
  this->result = local_20;
  Own<kj::FiberPool::Impl,_std::nullptr_t>::operator->
            ((Own<kj::FiberPool::Impl,_std::nullptr_t> *)result_local);
  FiberPool::Impl::takeStack((Impl *)&stack0xffffffffffffffa8);
  Own<kj::_::FiberStack,_std::nullptr_t>::operator=
            (&this->stack,(Own<kj::_::FiberStack,_std::nullptr_t> *)&stack0xffffffffffffffa8);
  Own<kj::_::FiberStack,_std::nullptr_t>::~Own
            ((Own<kj::_::FiberStack,_std::nullptr_t> *)&stack0xffffffffffffffa8);
  this_00 = Own<kj::_::FiberStack,_std::nullptr_t>::operator->(&this->stack);
  FiberStack::initialize(this_00,this);
  anon_unknown_173::ensureThreadCanRunFibers();
  return;
}

Assistant:

FiberBase::FiberBase(const FiberPool& pool, _::ExceptionOrValue& result, SourceLocation location)
    : Event(location), state(WAITING), result(result) {
  stack = pool.impl->takeStack();
  stack->initialize(*this);
  ensureThreadCanRunFibers();
}